

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createmidifile2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int aTick;
  size_t __n;
  void *__buf;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  uint local_410;
  int local_40c;
  int channel;
  int velocity;
  int i;
  int local_3e0;
  int local_3dc;
  int track;
  int actiontick;
  int brhythm [50];
  int local_308 [2];
  int bass [50];
  int local_238 [2];
  int mrhythm [50];
  int local_168 [2];
  int melody [50];
  int tpq;
  undefined1 local_88 [8];
  MidiFile midifile;
  char **argv_local;
  int argc_local;
  
  midifile._104_8_ = argv;
  smf::MidiFile::MidiFile((MidiFile *)local_88);
  smf::MidiFile::addTracks((MidiFile *)local_88,2);
  smf::MidiFile::setTicksPerQuarterNote((MidiFile *)local_88,0x78);
  memcpy(local_168,&DAT_0013a010,200);
  memcpy(local_238,&DAT_0013a0e0,200);
  memcpy(local_308,&DAT_0013a1b0,200);
  memcpy(&track,&DAT_0013a280,200);
  local_3dc = 0;
  local_3e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i,"Twinkle, Twinkle Little Star",(allocator *)((long)&velocity + 3));
  smf::MidiFile::addTrackName((MidiFile *)local_88,0,0,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&velocity + 3));
  smf::MidiFile::addTempo((MidiFile *)local_88,local_3e0,local_3dc,104.0);
  aTick = local_3dc;
  channel = 0;
  local_40c = 0x40;
  local_410 = 0;
  local_3e0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"Melody",&local_431);
  smf::MidiFile::addTrackName((MidiFile *)local_88,1,aTick,(string *)local_430);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  smf::MidiFile::addPatchChange((MidiFile *)local_88,local_3e0,local_3dc,local_410,0x28);
  while (-1 < melody[(long)channel + -2]) {
    smf::MidiFile::addNoteOn
              ((MidiFile *)local_88,local_3e0,local_3dc,local_410,melody[(long)channel + -2],
               local_40c);
    local_3dc = local_3dc + mrhythm[(long)channel + -2] * 0x78;
    smf::MidiFile::addNoteOff
              ((MidiFile *)local_88,local_3e0,local_3dc,local_410,melody[(long)channel + -2],
               local_40c);
    channel = channel + 1;
  }
  channel = 0;
  local_3dc = 0;
  local_40c = 0x5a;
  local_410 = 1;
  local_3e0 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"Bass line",&local_459);
  smf::MidiFile::addTrackName((MidiFile *)local_88,2,0,(string *)local_458);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  __n = (size_t)local_410;
  smf::MidiFile::addPatchChange((MidiFile *)local_88,local_3e0,local_3dc,local_410,0x3a);
  while (-1 < bass[(long)channel + -2]) {
    smf::MidiFile::addNoteOn
              ((MidiFile *)local_88,local_3e0,local_3dc,local_410,bass[(long)channel + -2],local_40c
              );
    local_3dc = local_3dc + (&track)[channel] * 0x78;
    __n = (size_t)local_410;
    smf::MidiFile::addNoteOff
              ((MidiFile *)local_88,local_3e0,local_3dc,local_410,bass[(long)channel + -2],local_40c
              );
    channel = channel + 1;
  }
  smf::MidiFile::sortTracks((MidiFile *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"twinkle.mid",&local_481);
  smf::MidiFile::write((MidiFile *)local_88,(int)local_480,__buf,__n);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile midifile;
   midifile.addTracks(2);    // Add another two tracks to the MIDI file
   int tpq = 120;            // ticks per quarter note
   midifile.setTicksPerQuarterNote(tpq);

   // melody to write to MIDI track 1: (60 = middle C)
                  // C5   C  G  G  A  A  G- F  F  E  E  D  D  C-
   int melody[50]  = {72,72,79,79,81,81,79,77,77,76,76,74,74,72,-1};
   int mrhythm[50] = { 1, 1, 1, 1, 1, 1, 2, 1, 1, 1, 1, 1, 1, 2,-1};

                  // C3 C4  E  C  F  C  E  C  D B3 C4 A3  F  G  C-
   int bass[50] =   {48,60,64,60,65,60,64,60,62,59,60,57,53,55,48,-1};
   int brhythm[50]= { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 2,-1};

   int actiontick = 0;
   int track      = 0;

   // Add some expression track (track 0) messages:
   midifile.addTrackName(track, actiontick, "Twinkle, Twinkle Little Star");
   midifile.addTempo(track, actiontick, 104.0);

   // Store melody line in track 1
   int i = 0;
   int velocity   = 64;
   int channel    = 0;
   track          = 1;

   midifile.addTrackName(track, actiontick, "Melody");
   midifile.addPatchChange(track, actiontick, channel, 40); // 40=violin

   while (melody[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, melody[i], velocity);
      actiontick += tpq * mrhythm[i];
      midifile.addNoteOff(track, actiontick, channel, melody[i], velocity);
      i++;
   }

   // Store a base line in track 2 on channel 1 (indexed from 0):
   i = 0;
   actiontick   = 0;
   velocity     = 90;
   channel      = 1;
   track        = 2;

   midifile.addTrackName(track, actiontick, "Bass line");
   midifile.addPatchChange(track, actiontick, channel, 58); // 58=tuba

   while (bass[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, bass[i], velocity);
      actiontick += tpq * brhythm[i];
      midifile.addNoteOff(track, actiontick, channel, bass[i], velocity);
      i++;
   }

   midifile.sortTracks();         // ensure tick times are in correct order
   midifile.write("twinkle.mid"); // write Standard MIDI File twinkle.mid
   return 0;
}